

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageOneofFieldGenerator::GenerateParsingCode
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  char *pcVar1;
  size_t sVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  vars = &(this->super_MessageFieldGenerator).super_FieldGeneratorBase.variables_;
  text_00._M_str =
       "$type_name$ subBuilder = new $type_name$();\nif ($has_property_check$) {\n  subBuilder.MergeFrom($property_name$);\n}\n"
  ;
  text_00._M_len = 0x73;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  if ((this->super_MessageFieldGenerator).super_FieldGeneratorBase.descriptor_[2] ==
      (FieldDescriptor)0xb) {
    pcVar1 = "input.ReadMessage(subBuilder);\n";
    sVar2 = 0x1f;
  }
  else {
    pcVar1 = "input.ReadGroup(subBuilder);\n";
    sVar2 = 0x1d;
  }
  text._M_str = pcVar1;
  text._M_len = sVar2;
  io::Printer::Print<>(printer,text);
  text_01._M_str = "$property_name$ = subBuilder;\n";
  text_01._M_len = 0x1e;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateParsingCode(io::Printer* printer) {
  // TODO: We may be able to do better than this
  printer->Print(
    variables_,
    "$type_name$ subBuilder = new $type_name$();\n"
    "if ($has_property_check$) {\n"
    "  subBuilder.MergeFrom($property_name$);\n"
    "}\n");
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print("input.ReadMessage(subBuilder);\n");
  } else {
    printer->Print("input.ReadGroup(subBuilder);\n");
  }
  printer->Print(variables_, "$property_name$ = subBuilder;\n");
}